

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::walkStacklessQuantizedTree
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax,
          int startNodeIndex,int endNodeIndex)

{
  bool bVar1;
  int iVar2;
  btQuantizedBvhNode *this_00;
  unsigned_short *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint aabbOverlap;
  bool isLeafNode;
  int escapeIndex;
  btQuantizedBvhNode *rootNode;
  int subTreeSize;
  int walkIterations;
  int curIndex;
  unsigned_short *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_30;
  int local_2c;
  
  local_30 = 0;
  this_00 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                      ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),in_R8D);
  local_2c = in_R8D;
  while (local_2c < in_R9D) {
    local_30 = local_30 + 1;
    in_stack_ffffffffffffffb4 =
         testQuantizedAabbAgainstQuantizedAabb
                   (this_00->m_quantizedAabbMin,
                    (unsigned_short *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (unsigned_short *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8);
    bVar1 = btQuantizedBvhNode::isLeafNode(this_00);
    in_stack_ffffffffffffffb8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb8);
    if ((bVar1) && (in_stack_ffffffffffffffb4 != 0)) {
      in_stack_ffffffffffffffa8 = in_RSI;
      in_stack_ffffffffffffffb0 = btQuantizedBvhNode::getPartId(this_00);
      iVar2 = btQuantizedBvhNode::getTriangleIndex(this_00);
      (**(code **)(*(long *)in_stack_ffffffffffffffa8 + 0x10))
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,iVar2);
    }
    if ((in_stack_ffffffffffffffb4 == 0) && ((in_stack_ffffffffffffffb8 & 0x1000000) == 0)) {
      in_stack_ffffffffffffffbc = btQuantizedBvhNode::getEscapeIndex(this_00);
      this_00 = this_00 + in_stack_ffffffffffffffbc;
      local_2c = in_stack_ffffffffffffffbc + local_2c;
    }
    else {
      this_00 = this_00 + 1;
      local_2c = local_2c + 1;
    }
  }
  if (maxIterations < local_30) {
    maxIterations = local_30;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessQuantizedTree(btNodeOverlapCallback* nodeCallback,unsigned short int* quantizedQueryAabbMin,unsigned short int* quantizedQueryAabbMax,int startNodeIndex,int endNodeIndex) const
{
	btAssert(m_useQuantization);
	
	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < endNodeIndex)
	{

//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern btIDebugDraw* debugDrawerPtr;
		if (curIndex==drawPatch)
		{
			btVector3 aabbMin,aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			btVector3	color(1,0,0);
			debugDrawerPtr->drawAabb(aabbMin,aabbMax,color);
		}
#endif//VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		btAssert (walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,rootNode->m_quantizedAabbMin,rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		
		if (isLeafNode && aabbOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(),rootNode->getTriangleIndex());
		} 
		
		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}